

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<float,int,float,duckdb::BinaryStandardOperatorWrapper,duckdb::RoundOperatorPrecision,bool,true,false>
               (float *ldata,int *rdata,float *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  int iVar1;
  unsigned_long *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  unsigned_long uVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float lentry_1;
  float lentry;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      fVar13 = *ldata;
      dVar3 = (double)fVar13;
      iVar7 = 0;
      do {
        iVar1 = rdata[iVar7];
        if (iVar1 < 0) {
          dVar4 = pow(10.0,(double)-(float)iVar1);
          dVar5 = round(dVar3 / dVar4);
          dVar5 = dVar5 * dVar4;
          fVar12 = 0.0;
        }
        else {
          dVar4 = pow(10.0,(double)iVar1);
          dVar5 = round(dVar4 * dVar3);
          dVar5 = dVar5 / dVar4;
          fVar12 = fVar13;
        }
        if ((ulong)ABS(dVar5) < 0x7ff0000000000000) {
          fVar12 = (float)dVar5;
        }
        result_data[iVar7] = fVar12;
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar6 = 0;
    uVar10 = 0;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar9 = 0xffffffffffffffff;
      }
      else {
        uVar9 = puVar2[uVar6];
      }
      uVar8 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar8 = count;
      }
      uVar11 = uVar8;
      if (uVar9 != 0) {
        uVar11 = uVar10;
        if (uVar9 == 0xffffffffffffffff) {
          if (uVar10 < uVar8) {
            fVar13 = *ldata;
            dVar3 = (double)fVar13;
            do {
              iVar1 = rdata[uVar10];
              if (iVar1 < 0) {
                dVar4 = pow(10.0,(double)-(float)iVar1);
                dVar5 = round(dVar3 / dVar4);
                dVar5 = dVar5 * dVar4;
                fVar12 = 0.0;
              }
              else {
                dVar4 = pow(10.0,(double)iVar1);
                dVar5 = round(dVar4 * dVar3);
                dVar5 = dVar5 / dVar4;
                fVar12 = fVar13;
              }
              if ((ulong)ABS(dVar5) < 0x7ff0000000000000) {
                fVar12 = (float)dVar5;
              }
              result_data[uVar10] = fVar12;
              uVar10 = uVar10 + 1;
              uVar11 = uVar10;
            } while (uVar8 != uVar10);
          }
        }
        else if (uVar10 < uVar8) {
          uVar11 = 0;
          do {
            if ((uVar9 >> (uVar11 & 0x3f) & 1) != 0) {
              fVar13 = *ldata;
              iVar1 = rdata[uVar10 + uVar11];
              if (iVar1 < 0) {
                dVar5 = pow(10.0,(double)-(float)iVar1);
                dVar3 = round((double)fVar13 / dVar5);
                dVar3 = dVar3 * dVar5;
                fVar13 = 0.0;
              }
              else {
                dVar5 = pow(10.0,(double)iVar1);
                dVar3 = round((double)fVar13 * dVar5);
                dVar3 = dVar3 / dVar5;
              }
              if ((ulong)ABS(dVar3) < 0x7ff0000000000000) {
                fVar13 = (float)dVar3;
              }
              result_data[uVar10 + uVar11] = fVar13;
            }
            uVar11 = uVar11 + 1;
          } while ((uVar10 - uVar8) + uVar11 != 0);
          uVar11 = uVar10 + uVar11;
        }
      }
      uVar6 = uVar6 + 1;
      uVar10 = uVar11;
    } while (uVar6 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}